

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O3

void ReverbConvertI3DL2ToNative9
               (FAudioFXReverbI3DL2Parameters *pI3DL2,FAudioFXReverbParameters9 *pNative,
               int32_t sevenDotOneReverb)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t uVar3;
  int iVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  
  uVar3 = '\x14';
  if (sevenDotOneReverb == 0) {
    uVar3 = '\x05';
  }
  pNative->RearDelay = uVar3;
  pNative->SideDelay = '\x05';
  pNative->PositionLeft = '\x06';
  pNative->PositionRight = '\x06';
  pNative->PositionMatrixLeft = '\x1b';
  pNative->PositionMatrixRight = '\x1b';
  pNative->RoomSize = 100.0;
  pNative->LowEQCutoff = '\x04';
  pNative->HighEQCutoff = '\x06';
  uVar1 = pI3DL2->Room;
  uVar2 = pI3DL2->RoomHF;
  auVar10._0_4_ = (float)(int)uVar1;
  auVar10._4_4_ = (float)(int)uVar2;
  auVar10._8_8_ = 0;
  auVar10 = divps(auVar10,_DAT_00126980);
  pNative->RoomFilterMain = (float)(int)auVar10._0_8_;
  pNative->RoomFilterHF = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  fVar8 = pI3DL2->DecayHFRatio;
  dVar9 = (double)SDL_log10((double)fVar8);
  fVar12 = pI3DL2->DecayTime;
  if (1.0 <= fVar8) {
    iVar4 = (int)(dVar9 * -4.0);
    iVar6 = -8;
    if (-8 < iVar4) {
      iVar6 = iVar4;
    }
    uVar3 = '\b';
    if (iVar4 < 0) {
      uVar3 = (char)iVar6 + '\b';
    }
    fVar12 = fVar12 * pI3DL2->DecayHFRatio;
    uVar5 = '\b';
  }
  else {
    iVar4 = (int)(dVar9 * 4.0);
    iVar6 = -8;
    if (-8 < iVar4) {
      iVar6 = iVar4;
    }
    uVar5 = '\b';
    if (iVar4 < 0) {
      uVar5 = (char)iVar6 + '\b';
    }
    uVar3 = '\b';
  }
  pNative->LowEQGain = uVar3;
  pNative->HighEQGain = uVar5;
  pNative->DecayTime = fVar12;
  fVar8 = pI3DL2->ReflectionsDelay * 1000.0;
  if (300.0 <= fVar8) {
    fVar8 = 299.0;
  }
  else if (fVar8 <= 1.0) {
    fVar8 = 1.0;
  }
  pNative->ReflectionsDelay = (uint32_t)(long)fVar8;
  fVar8 = pI3DL2->ReverbDelay * 1000.0;
  uVar7 = -(uint)(fVar8 < 85.0);
  pNative->ReverbDelay = (uint8_t)(int)(float)(~uVar7 & 0x42a80000 | (uint)fVar8 & uVar7);
  auVar11._0_4_ = (float)pI3DL2->Reflections;
  auVar11._4_4_ = (float)pI3DL2->Reverb;
  auVar11._8_8_ = 0;
  auVar10 = divps(auVar11,_DAT_00126980);
  pNative->ReflectionsGain = (float)(int)auVar10._0_8_;
  pNative->ReverbGain = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  uVar3 = (uint8_t)(int)((pI3DL2->Diffusion * 15.0) / 100.0);
  pNative->EarlyDiffusion = uVar3;
  pNative->LateDiffusion = uVar3;
  pNative->Density = pI3DL2->Density;
  pNative->RoomFilterFreq = pI3DL2->HFReference;
  pNative->WetDryMix = pI3DL2->WetDryMix;
  return;
}

Assistant:

void ReverbConvertI3DL2ToNative9(
	const FAudioFXReverbI3DL2Parameters *pI3DL2,
	FAudioFXReverbParameters9 *pNative,
	int32_t sevenDotOneReverb
) {
	float reflectionsDelay;
	float reverbDelay;

	if (sevenDotOneReverb)
	{
		pNative->RearDelay = FAUDIOFX_REVERB_DEFAULT_7POINT1_REAR_DELAY;
	}
	else
	{
		pNative->RearDelay = FAUDIOFX_REVERB_DEFAULT_REAR_DELAY;
	}
	pNative->SideDelay = FAUDIOFX_REVERB_DEFAULT_7POINT1_SIDE_DELAY;
	pNative->PositionLeft = FAUDIOFX_REVERB_DEFAULT_POSITION;
	pNative->PositionRight = FAUDIOFX_REVERB_DEFAULT_POSITION;
	pNative->PositionMatrixLeft = FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX;
	pNative->PositionMatrixRight = FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX;
	pNative->RoomSize = FAUDIOFX_REVERB_DEFAULT_ROOM_SIZE;
	pNative->LowEQCutoff = 4;
	pNative->HighEQCutoff = 6;

	pNative->RoomFilterMain = (float) pI3DL2->Room / 100.0f;
	pNative->RoomFilterHF = (float) pI3DL2->RoomHF / 100.0f;

	if (pI3DL2->DecayHFRatio >= 1.0f)
	{
		int32_t index = (int32_t) (-4.0 * FAudio_log10(pI3DL2->DecayHFRatio));
		if (index < -8)
		{
			index = -8;
		}
		pNative->LowEQGain = (uint8_t) ((index < 0) ? index + 8 : 8);
		pNative->HighEQGain = 8;
		pNative->DecayTime = pI3DL2->DecayTime * pI3DL2->DecayHFRatio;
	}
	else
	{
		int32_t index = (int32_t) (4.0 * FAudio_log10(pI3DL2->DecayHFRatio));
		if (index < -8)
		{
			index = -8;
		}
		pNative->LowEQGain = 8;
		pNative->HighEQGain = (uint8_t) ((index < 0) ? index + 8 : 8);
		pNative->DecayTime = pI3DL2->DecayTime;
	}

	reflectionsDelay = pI3DL2->ReflectionsDelay * 1000.0f;
	if (reflectionsDelay >= FAUDIOFX_REVERB_MAX_REFLECTIONS_DELAY)
	{
		reflectionsDelay = (float) (FAUDIOFX_REVERB_MAX_REFLECTIONS_DELAY - 1);
	}
	else if (reflectionsDelay <= 1)
	{
		reflectionsDelay = 1;
	}
	pNative->ReflectionsDelay = (uint32_t) reflectionsDelay;

	reverbDelay = pI3DL2->ReverbDelay * 1000.0f;
	if (reverbDelay >= FAUDIOFX_REVERB_MAX_REVERB_DELAY)
	{
		reverbDelay = (float) (FAUDIOFX_REVERB_MAX_REVERB_DELAY - 1);
	}
	pNative->ReverbDelay = (uint8_t) reverbDelay;

	pNative->ReflectionsGain = pI3DL2->Reflections / 100.0f;
	pNative->ReverbGain = pI3DL2->Reverb / 100.0f;
	pNative->EarlyDiffusion = (uint8_t) (15.0f * pI3DL2->Diffusion / 100.0f);
	pNative->LateDiffusion = pNative->EarlyDiffusion;
	pNative->Density = pI3DL2->Density;
	pNative->RoomFilterFreq = pI3DL2->HFReference;

	pNative->WetDryMix = pI3DL2->WetDryMix;
}